

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.h
# Opt level: O0

void __thiscall
argParserAdvancedConfiguration::argument::argument
          (argument *this,string *argS,string *argL,string *helpMessage,function<void_()> *lambda_)

{
  allocator local_31;
  function<void_()> *local_30;
  function<void_()> *lambda__local;
  string *helpMessage_local;
  string *argL_local;
  string *argS_local;
  argument *this_local;
  
  local_30 = lambda_;
  lambda__local = (function<void_()> *)helpMessage;
  helpMessage_local = argL;
  argL_local = argS;
  argS_local = &this->argShort;
  std::__cxx11::string::string((string *)this,(string *)argS);
  std::__cxx11::string::string((string *)&this->argLong,(string *)argL);
  std::__cxx11::string::string((string *)&this->helpMessage,(string *)helpMessage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->additionalHelp,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&this->enums);
  std::function<int_(int,_char_**)>::function(&this->callBack,(nullptr_t)0x0);
  std::function<void_()>::function(&this->simpleCallBack,lambda_);
  this->requiredAndNotHitJet = false;
  this->numberOfArguments = -1;
  return;
}

Assistant:

argument(string argS, string argL, string helpMessage, function<void()> lambda_) : argLong(
                std::move(argL)), argShort(std::move(argS)), simpleCallBack(lambda_), helpMessage(
                std::move(helpMessage)) {}